

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O0

void __thiscall
syntax_tests::iu_SyntaxTest_x_iutest_x_StrCaseNe_Test::~iu_SyntaxTest_x_iutest_x_StrCaseNe_Test
          (iu_SyntaxTest_x_iutest_x_StrCaseNe_Test *this)

{
  iu_SyntaxTest_x_iutest_x_StrCaseNe_Test *this_local;
  
  ~iu_SyntaxTest_x_iutest_x_StrCaseNe_Test(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

IUTEST(SyntaxTest, StrCaseNe)
{
    const char test[] = "host";
    if( const char* p = "test" )
        IUTEST_ASSERT_STRCASENE(p, test) << p;
    if( const char* p = "test" )
        IUTEST_EXPECT_STRCASENE(p, test) << p;
    if( const char* p = "test" )
        IUTEST_INFORM_STRCASENE(p, test) << p;
    if( const char* p = "test" )
        IUTEST_ASSUME_STRCASENE(p, test) << p;
}